

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O2

void aes_ni_setkey(ssh_cipher *ciph,void *vkey)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  ssh_cipher *psVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ssh_cipher *psVar11;
  ulong uVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined8 uStack_120;
  uint local_118 [2];
  undefined8 auStack_110 [30];
  
  psVar11 = ciph + -0x3f;
  uVar2 = ciph->vt->real_keybits;
  uVar12 = (ulong)((int)uVar2 / 0x20);
  uVar9 = 0;
  uVar10 = 0;
  do {
    if (uVar12 * -4 + uVar9 == 0x1c) {
      lVar4 = uVar12 + 7;
      lVar5 = 0;
      while (bVar13 = lVar4 != 0, lVar4 = lVar4 + -1, bVar13) {
        uVar3 = *(undefined8 *)((long)auStack_110 + lVar5);
        puVar1 = (undefined8 *)((long)&psVar11->vt + lVar5);
        *puVar1 = *(undefined8 *)((long)auStack_110 + lVar5 + -8);
        puVar1[1] = uVar3;
        lVar5 = lVar5 + 0x10;
      }
      uStack_120 = (code *)0x153b74;
      smemclr(local_118,0xf0);
      psVar6 = ciph + uVar12 * 2 + -0x15;
      for (lVar4 = 0; uVar12 + 7 != lVar4; lVar4 = lVar4 + 1) {
        auVar14 = *(undefined1 (*) [16])psVar11;
        if ((lVar4 != 0) && (uVar12 + 6 != lVar4)) {
          auVar14 = aesimc(auVar14);
        }
        *(undefined1 (*) [16])psVar6 = auVar14;
        psVar11 = psVar11 + 2;
        psVar6 = psVar6 + -2;
      }
      return;
    }
    if (uVar9 < uVar12) {
      uVar8 = *(uint *)((long)vkey + uVar9 * 4);
    }
    else {
      uVar8 = *(uint *)((long)&uStack_120 + uVar9 * 4 + 4);
      if (uVar9 % uVar12 == 0) {
        if (9 < uVar10) {
          uStack_120 = aes128_ni_cbc_encrypt;
          __assert_fail("rconpos < lenof(aes_key_setup_round_constants)",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/aes-ni.c"
                        ,0x52,
                        "void aes_ni_key_expand(const unsigned char *, size_t, __m128i *, __m128i *)"
                       );
        }
        auVar14 = aeskeygenassist(ZEXT416(uVar8) << 0x20,0);
        uVar7 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        uVar8 = (uint)aes_key_setup_round_constants[uVar7] ^ auVar14._4_4_;
      }
      else if (((uint)uVar9 & 7) == 4 && (uVar2 & 0xffffffe0) == 0x100) {
        auVar14 = aeskeygenassist(ZEXT416(uVar8) << 0x20,0);
        uVar8 = auVar14._0_4_;
      }
      uVar8 = uVar8 ^ *(uint *)((long)auStack_110 + uVar9 * 4 + uVar12 * -4 + -8);
    }
    *(uint *)((long)auStack_110 + uVar9 * 4 + -8) = uVar8;
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static void aes_ni_setkey(ssh_cipher *ciph, const void *vkey)
{
    aes_ni_context *ctx = container_of(ciph, aes_ni_context, ciph);
    const unsigned char *key = (const unsigned char *)vkey;

    aes_ni_key_expand(key, ctx->ciph.vt->real_keybits / 32,
                      ctx->keysched_e, ctx->keysched_d);
}